

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O0

void duckdb::ListRangeFunction<duckdb::TimestampRangeInfo,false>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  interval_t increment_00;
  VectorType VVar1;
  bool bVar2;
  idx_t iVar3;
  reference this;
  list_entry_t *plVar4;
  ValidityMask *row_idx;
  uint64_t uVar5;
  int64_t iVar6;
  RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *pRVar7;
  TYPE this_00;
  Vector *in_RDX;
  DataChunk *in_RDI;
  INCREMENT_TYPE IVar8;
  idx_t range_idx;
  TYPE range_value;
  INCREMENT_TYPE increment;
  TYPE start_value;
  idx_t i_2;
  idx_t total_idx;
  timestamp_t *range_data;
  idx_t i_1;
  uint64_t total_size;
  ValidityMask *result_validity;
  list_entry_t *list_data;
  idx_t i;
  VectorType result_type;
  idx_t args_size;
  RangeInfoStruct<duckdb::TimestampRangeInfo,_false> info;
  size_type in_stack_fffffffffffffe08;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  TYPE in_stack_fffffffffffffe20;
  RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *in_stack_fffffffffffffe28;
  RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *this_01;
  list_entry_t *this_02;
  ulong local_180;
  ulong local_158;
  long local_150;
  ulong local_140;
  DataChunk *in_stack_fffffffffffffec8;
  uint64_t uVar9;
  RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *in_stack_fffffffffffffed0;
  ulong local_110;
  ulong local_100;
  
  RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::RangeInfoStruct
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_100 = 1;
  local_110 = 0;
  do {
    iVar3 = DataChunk::ColumnCount((DataChunk *)0xd4a87e);
    if (iVar3 <= local_110) {
LAB_00d4a919:
      plVar4 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0xd4a926);
      this_02 = plVar4;
      row_idx = FlatVector::Validity((Vector *)0xd4a947);
      uVar9 = 0;
      for (local_140 = 0; local_140 < local_100; local_140 = local_140 + 1) {
        bVar2 = RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::RowIsValid
                          (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20.value);
        if (bVar2) {
          plVar4[local_140].offset = uVar9;
          uVar5 = RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::ListLength
                            ((RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *)this_02,
                             (idx_t)row_idx);
          plVar4[local_140].length = uVar5;
          uVar9 = plVar4[local_140].length + uVar9;
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          plVar4[local_140].offset = uVar9;
          plVar4[local_140].length = 0;
        }
      }
      duckdb::ListVector::Reserve(in_RDX,uVar9);
      iVar6 = duckdb::ListVector::GetEntry(in_RDX);
      pRVar7 = (RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *)
               FlatVector::GetData<duckdb::timestamp_t>((Vector *)0xd4aae2);
      IVar8.micros = (int64_t)in_stack_fffffffffffffe10;
      IVar8.months = (int)in_stack_fffffffffffffe18;
      IVar8.days = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
      local_150 = 0;
      this_01 = pRVar7;
      for (local_158 = 0; iVar3 = IVar8._0_8_, local_158 < local_100; local_158 = local_158 + 1) {
        this_00 = RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::StartListValue
                            (this_01,in_stack_fffffffffffffe20.value);
        in_stack_fffffffffffffe20 = this_00;
        IVar8 = RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::ListIncrementValue
                          ((RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *)this_00.value,iVar3
                          );
        for (local_180 = 0; local_180 < plVar4[local_158].length; local_180 = local_180 + 1) {
          if (local_180 != 0) {
            increment_00.micros = iVar6;
            increment_00._0_8_ = this_01;
            TimestampRangeInfo::Increment
                      ((timestamp_t *)in_stack_fffffffffffffe20.value,increment_00);
          }
          (&pRVar7->args)[local_150] = (DataChunk *)this_00.value;
          local_150 = local_150 + 1;
        }
      }
      duckdb::ListVector::SetListSize(in_RDX,uVar9);
      duckdb::Vector::SetVectorType((VectorType)in_RDX);
      DataChunk::size(in_RDI);
      duckdb::Vector::Verify((ulong)in_RDX);
      RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::~RangeInfoStruct
                ((RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *)
                 in_stack_fffffffffffffe20.value);
      return;
    }
    this = vector<duckdb::Vector,_true>::operator[]
                     ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe08);
    VVar1 = Vector::GetVectorType(this);
    if (VVar1 != CONSTANT_VECTOR) {
      local_100 = DataChunk::size(in_RDI);
      goto LAB_00d4a919;
    }
    local_110 = local_110 + 1;
  } while( true );
}

Assistant:

static void ListRangeFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);

	RangeInfoStruct<OP, INCLUSIVE_BOUND> info(args);
	idx_t args_size = 1;
	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			args_size = args.size();
			result_type = VectorType::FLAT_VECTOR;
			break;
		}
	}
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_validity = FlatVector::Validity(result);
	uint64_t total_size = 0;
	for (idx_t i = 0; i < args_size; i++) {
		if (!info.RowIsValid(i)) {
			result_validity.SetInvalid(i);
			list_data[i].offset = total_size;
			list_data[i].length = 0;
		} else {
			list_data[i].offset = total_size;
			list_data[i].length = info.ListLength(i);
			total_size += list_data[i].length;
		}
	}

	// now construct the child vector of the list
	ListVector::Reserve(result, total_size);
	auto range_data = FlatVector::GetData<typename OP::TYPE>(ListVector::GetEntry(result));
	idx_t total_idx = 0;
	for (idx_t i = 0; i < args_size; i++) {
		typename OP::TYPE start_value = info.StartListValue(i);
		typename OP::INCREMENT_TYPE increment = info.ListIncrementValue(i);

		typename OP::TYPE range_value = start_value;
		for (idx_t range_idx = 0; range_idx < list_data[i].length; range_idx++) {
			if (range_idx > 0) {
				OP::Increment(range_value, increment);
			}
			range_data[total_idx++] = range_value;
		}
	}

	ListVector::SetListSize(result, total_size);
	result.SetVectorType(result_type);

	result.Verify(args.size());
}